

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O0

void __thiscall
QSslServerPrivate::handleHandshakeTimedOut(QSslServerPrivate *this,QSslSocket *socket)

{
  int iVar1;
  QSslServer *_t1;
  ulong uVar2;
  QSslServerPrivate *in_RSI;
  QSslServerPrivate *in_RDI;
  QSslServer *q;
  quintptr in_stack_00000028;
  QSslServer *in_stack_ffffffffffffffd8;
  
  _t1 = q_func(in_RDI);
  removeSocketData(in_RSI,in_stack_00000028);
  (**(code **)(*(long *)&in_RSI->super_QTcpServerPrivate + 0x100))();
  QSslServer::errorOccurred
            (in_stack_ffffffffffffffd8,(QSslSocket *)_t1,(SocketError)((ulong)in_RDI >> 0x20));
  QObject::deleteLater();
  uVar2 = (**(code **)(*(long *)(in_RDI->super_QTcpServerPrivate).socketEngine + 0x138))();
  if ((uVar2 & 1) == 0) {
    iVar1 = (**(code **)(*(long *)&in_RDI->super_QTcpServerPrivate + 0x28))();
    if (iVar1 < (in_RDI->super_QTcpServerPrivate).maxConnections) {
      QTcpServer::resumeAccepting((QTcpServer *)0x3b1acc);
    }
  }
  return;
}

Assistant:

void QSslServerPrivate::handleHandshakeTimedOut(QSslSocket *socket)
{
    Q_Q(QSslServer);
    removeSocketData(quintptr(socket));
    socket->disconnectFromHost();
    Q_EMIT q->errorOccurred(socket, QAbstractSocket::SocketTimeoutError);
    socket->deleteLater();
    if (!socketEngine->isReadNotificationEnabled() && totalPendingConnections() < maxConnections)
        q->resumeAccepting();
}